

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

QMimeData * __thiscall QTextEditControl::createMimeDataFromSelection(QTextEditControl *this)

{
  long *plVar1;
  QMimeData *pQVar2;
  
  plVar1 = (long *)QMetaObject::cast((QObject *)&QTextEdit::staticMetaObject);
  if (plVar1 != (long *)0x0) {
    pQVar2 = (QMimeData *)(**(code **)(*plVar1 + 0x1d0))(plVar1);
    return pQVar2;
  }
  pQVar2 = QWidgetTextControl::createMimeDataFromSelection((QWidgetTextControl *)this);
  return pQVar2;
}

Assistant:

virtual QMimeData *createMimeDataFromSelection() const override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::createMimeDataFromSelection();
        return ed->createMimeDataFromSelection();
    }